

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

ON_SHA1_Hash * __thiscall ON_TextMask::ContentHash(ON_TextMask *this)

{
  ON_SHA1_Hash *this_00;
  MaskType MVar1;
  MaskFrame MVar2;
  bool bVar3;
  uint u;
  ON_SHA1 sha1;
  ON_SHA1_Hash local_bc;
  ON_SHA1 local_a8;
  
  this_00 = &this->m_content_hash;
  bVar3 = ON_SHA1_Hash::IsZeroDigest(this_00);
  if (bVar3) {
    ON_SHA1::ON_SHA1(&local_a8);
    MVar1 = this->m_mask_type;
    MVar2 = this->m_mask_frame;
    ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)this->m_bDrawMask);
    ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)MVar1);
    ON_SHA1::AccumulateUnsigned32(&local_a8,(uint)MVar2);
    u = ON_Color::operator_cast_to_unsigned_int(&this->m_mask_color);
    ON_SHA1::AccumulateUnsigned32(&local_a8,u);
    ON_SHA1::AccumulateDouble(&local_a8,this->m_mask_border);
    ON_SHA1::Hash(&local_bc,&local_a8);
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) = local_bc.m_digest._16_4_;
    *(undefined8 *)this_00->m_digest = local_bc.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = local_bc.m_digest._8_8_;
  }
  return this_00;
}

Assistant:

const ON_SHA1_Hash& ON_TextMask::ContentHash() const
{
  if (m_content_hash.IsZeroDigest())
  {
    ON_SHA1 sha1;
    unsigned int u[3] = {
      (m_bDrawMask ? 1U : 0U),
      (unsigned int)(static_cast<unsigned char>(m_mask_type)),
      (unsigned int)(static_cast<unsigned char>(m_mask_frame))
    };
    sha1.AccumulateUnsigned32(u[0]);
    sha1.AccumulateUnsigned32(u[1]);
    sha1.AccumulateUnsigned32(u[2]);
    sha1.AccumulateUnsigned32(m_mask_color);
    sha1.AccumulateDouble(m_mask_border);
    m_content_hash = sha1.Hash();
  }
  return m_content_hash;
}